

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::EnumValueDescriptor::GetLocationPath
          (EnumValueDescriptor *this,vector<int,_std::allocator<int>_> *output)

{
  vector<int,_std::allocator<int>_> *this_00;
  EnumDescriptor *this_01;
  int __c;
  char *pcVar1;
  value_type_conflict2 local_1c;
  vector<int,_std::allocator<int>_> *local_18;
  vector<int,_std::allocator<int>_> *output_local;
  EnumValueDescriptor *this_local;
  
  local_18 = output;
  output_local = (vector<int,_std::allocator<int>_> *)this;
  this_01 = type(this);
  EnumDescriptor::GetLocationPath(this_01,local_18);
  pcVar1 = "\x02";
  std::vector<int,_std::allocator<int>_>::push_back
            (local_18,&EnumDescriptorProto::kValueFieldNumber);
  this_00 = local_18;
  pcVar1 = index(this,pcVar1,__c);
  local_1c = (value_type_conflict2)pcVar1;
  std::vector<int,_std::allocator<int>_>::push_back(this_00,&local_1c);
  return;
}

Assistant:

void EnumValueDescriptor::GetLocationPath(std::vector<int>* output) const {
  type()->GetLocationPath(output);
  output->push_back(EnumDescriptorProto::kValueFieldNumber);
  output->push_back(index());
}